

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O2

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  long lVar14;
  int j_1;
  ulong uVar15;
  int j;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  
  iVar3 = bottom_blob->dims;
  if (iVar3 == 3) {
    iVar3 = bottom_blob->w;
    iVar5 = bottom_blob->h;
    uVar4 = bottom_blob->c;
    Mat::create(top_blob,iVar3,iVar5,uVar4,4,opt->blob_allocator);
    pvVar9 = top_blob->data;
    iVar8 = -100;
    if ((pvVar9 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar17 = iVar5 * iVar3;
      iVar3 = this->scale_data_size;
      iVar5 = this->bias_data_size;
      lVar14 = bottom_blob->elemsize * bottom_blob->cstep;
      pvVar13 = bottom_blob->data;
      lVar11 = top_blob->cstep * top_blob->elemsize;
      uVar10 = 0;
      iVar8 = 0;
      if (iVar5 == 0) {
        uVar12 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar12 = uVar10;
        }
        uVar18 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar18 = uVar10;
        }
        for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
          uVar16 = uVar15 & 0xffffffff;
          if (iVar3 == 1) {
            uVar16 = uVar10;
          }
          fVar1 = *(float *)((long)(this->scale_data).data + uVar16 * 4);
          for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)((long)pvVar9 + uVar16 * 4) =
                 (float)*(int *)((long)pvVar13 + uVar16 * 4) * fVar1;
          }
          pvVar9 = (void *)((long)pvVar9 + lVar11);
          pvVar13 = (void *)((long)pvVar13 + lVar14);
        }
      }
      else {
        uVar12 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar12 = uVar10;
        }
        uVar18 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar18 = uVar10;
        }
        for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
          uVar16 = uVar15 & 0xffffffff;
          if (iVar3 == 1) {
            uVar16 = uVar10;
          }
          fVar1 = *(float *)((long)(this->scale_data).data + uVar16 * 4);
          uVar16 = uVar15 & 0xffffffff;
          if (iVar5 == 1) {
            uVar16 = uVar10;
          }
          fVar2 = *(float *)((long)(this->bias_data).data + uVar16 * 4);
          for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)((long)pvVar9 + uVar16 * 4) =
                 (float)*(int *)((long)pvVar13 + uVar16 * 4) * fVar1 + fVar2;
          }
          pvVar9 = (void *)((long)pvVar9 + lVar11);
          pvVar13 = (void *)((long)pvVar13 + lVar14);
        }
      }
    }
  }
  else if (iVar3 == 2) {
    uVar4 = bottom_blob->w;
    uVar17 = bottom_blob->h;
    Mat::create(top_blob,uVar4,uVar17,4,opt->blob_allocator);
    pvVar9 = top_blob->data;
    iVar8 = -100;
    if ((pvVar9 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar3 = this->scale_data_size;
      iVar5 = this->bias_data_size;
      pvVar13 = bottom_blob->data;
      lVar11 = (long)bottom_blob->w * bottom_blob->elemsize;
      lVar14 = (long)top_blob->w * top_blob->elemsize;
      uVar10 = 0;
      iVar8 = 0;
      if (iVar5 == 0) {
        uVar12 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar12 = uVar10;
        }
        uVar18 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar18 = uVar10;
        }
        for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
          uVar16 = uVar15 & 0xffffffff;
          if (iVar3 == 1) {
            uVar16 = uVar10;
          }
          fVar1 = *(float *)((long)(this->scale_data).data + uVar16 * 4);
          for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)((long)pvVar9 + uVar16 * 4) =
                 (float)*(int *)((long)pvVar13 + uVar16 * 4) * fVar1;
          }
          pvVar9 = (void *)((long)pvVar9 + lVar14);
          pvVar13 = (void *)((long)pvVar13 + lVar11);
        }
      }
      else {
        uVar12 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar12 = uVar10;
        }
        uVar18 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar18 = uVar10;
        }
        for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
          uVar16 = uVar15 & 0xffffffff;
          if (iVar3 == 1) {
            uVar16 = uVar10;
          }
          fVar1 = *(float *)((long)(this->scale_data).data + uVar16 * 4);
          uVar16 = uVar15 & 0xffffffff;
          if (iVar5 == 1) {
            uVar16 = uVar10;
          }
          fVar2 = *(float *)((long)(this->bias_data).data + uVar16 * 4);
          for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
            *(float *)((long)pvVar9 + uVar16 * 4) =
                 (float)*(int *)((long)pvVar13 + uVar16 * 4) * fVar1 + fVar2;
          }
          pvVar9 = (void *)((long)pvVar9 + lVar14);
          pvVar13 = (void *)((long)pvVar13 + lVar11);
        }
      }
    }
  }
  else {
    iVar8 = 0;
    if (iVar3 == 1) {
      uVar4 = bottom_blob->w;
      Mat::create(top_blob,uVar4,4,opt->blob_allocator);
      pvVar9 = top_blob->data;
      iVar8 = -100;
      if ((pvVar9 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        pvVar13 = bottom_blob->data;
        if (this->scale_data_size == 1) {
          fVar1 = *(this->scale_data).data;
          if (this->bias_data_size == 1) {
            fVar2 = *(this->bias_data).data;
            iVar8 = 0;
            uVar10 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              uVar10 = 0;
            }
            for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar9 + uVar12 * 4) =
                   (float)*(int *)((long)pvVar13 + uVar12 * 4) * fVar1 + fVar2;
            }
          }
          else if (this->bias_data_size == 0) {
            iVar8 = 0;
            if ((int)uVar4 < 1) {
              uVar4 = 0;
            }
            for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
              *(float *)((long)pvVar9 + uVar10 * 4) =
                   (float)*(int *)((long)pvVar13 + uVar10 * 4) * fVar1;
            }
          }
          else {
            pvVar6 = (this->bias_data).data;
            iVar8 = 0;
            if ((int)uVar4 < 1) {
              uVar4 = 0;
            }
            for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
              *(float *)((long)pvVar9 + uVar10 * 4) =
                   (float)*(int *)((long)pvVar13 + uVar10 * 4) * fVar1 +
                   *(float *)((long)pvVar6 + uVar10 * 4);
            }
          }
        }
        else if (this->bias_data_size == 1) {
          pvVar6 = (this->scale_data).data;
          fVar1 = *(this->bias_data).data;
          iVar8 = 0;
          uVar10 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar10 = 0;
          }
          for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar9 + uVar12 * 4) =
                 (float)*(int *)((long)pvVar13 + uVar12 * 4) * *(float *)((long)pvVar6 + uVar12 * 4)
                 + fVar1;
          }
        }
        else if (this->bias_data_size == 0) {
          pvVar6 = (this->scale_data).data;
          iVar8 = 0;
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar9 + uVar10 * 4) =
                 (float)*(int *)((long)pvVar13 + uVar10 * 4) * *(float *)((long)pvVar6 + uVar10 * 4)
            ;
          }
        }
        else {
          pvVar6 = (this->scale_data).data;
          pvVar7 = (this->bias_data).data;
          iVar8 = 0;
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar9 + uVar10 * 4) =
                 (float)*(int *)((long)pvVar13 + uVar10 * 4) * *(float *)((long)pvVar6 + uVar10 * 4)
                 + *(float *)((long)pvVar7 + uVar10 * 4);
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
        }
        else
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i];
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias_data[i];
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
    }

    return 0;
}